

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_store_doinsert(t_list_store *x,t_symbol *s,int argc,t_atom *argv,int index)

{
  t_alist *x_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  t_listelem *ptVar5;
  t_listelem *ptVar6;
  int iVar7;
  int iVar8;
  
  ptVar6 = (x->x_alist).l_vec;
  lVar4 = (long)(x->x_alist).l_n;
  iVar7 = (int)s;
  ptVar5 = (t_listelem *)resizebytes(ptVar6,lVar4 * 0x28,(lVar4 + iVar7) * 0x28);
  (x->x_alist).l_vec = ptVar5;
  if (ptVar5 != (t_listelem *)0x0) {
    x_00 = &x->x_alist;
    if ((ptVar5 != ptVar6) && ((x->x_alist).l_npointer != 0)) {
      alist_restore_gpointers(x_00,0,(x->x_alist).l_n);
    }
    iVar2 = (x->x_alist).l_n;
    iVar8 = (int)argv;
    iVar3 = iVar2 - iVar8;
    if (iVar3 != 0 && iVar8 <= iVar2) {
      ptVar6 = (x->x_alist).l_vec + iVar8;
      memmove(ptVar6 + iVar7,ptVar6,(long)iVar3 * 0x28);
      if ((x->x_alist).l_npointer != 0) {
        alist_restore_gpointers(x_00,iVar8 + iVar7,(x->x_alist).l_n - iVar8);
      }
    }
    alist_copyin(x_00,(t_symbol *)((ulong)s & 0xffffffff),argc,(t_atom *)((ulong)argv & 0xffffffff),
                 index);
    piVar1 = &(x->x_alist).l_n;
    *piVar1 = *piVar1 + iVar7;
    return;
  }
  (x->x_alist).l_n = 0;
  pd_error((void *)0x0,"list: out of memory");
  return;
}

Assistant:

static void list_store_doinsert(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv, int index)
{
    t_listelem *oldptr = x->x_alist.l_vec;
        /* try to allocate more memory */
    if (!(x->x_alist.l_vec = (t_listelem *)resizebytes(x->x_alist.l_vec,
        (x->x_alist.l_n) * sizeof(*x->x_alist.l_vec),
        (x->x_alist.l_n + argc) * sizeof(*x->x_alist.l_vec))))
    {
        x->x_alist.l_n = 0;
        pd_error(0, "list: out of memory");
        return;
    }
        /* fix gpointers in case resizebytes() has moved the alist in memory */
    if (x->x_alist.l_vec != oldptr && x->x_alist.l_npointer)
        alist_restore_gpointers(&x->x_alist, 0, x->x_alist.l_n);
        /* shift existing elements after 'index' to the right */
    if (index < x->x_alist.l_n)
    {
        memmove(x->x_alist.l_vec + index + argc, x->x_alist.l_vec + index,
            (x->x_alist.l_n - index) * sizeof(*x->x_alist.l_vec));
            /* fix gpointers because of memmove() */
        if (x->x_alist.l_npointer)
            alist_restore_gpointers(&x->x_alist, index + argc, x->x_alist.l_n - index);
    }
        /* finally copy new elements */
    alist_copyin(&x->x_alist, s, argc, argv, index);
    x->x_alist.l_n += argc;
}